

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

xmlSchemaValPtr xmlSchemaCopyValue(xmlSchemaValPtr val)

{
  xmlSchemaValType xVar1;
  _xmlSchemaVal *p_Var2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  xmlChar *pxVar8;
  xmlSchemaValPtr pxVar9;
  xmlSchemaValPtr pxVar10;
  xmlSchemaValPtr pxVar11;
  xmlSchemaValPtr value;
  
  if (val == (xmlSchemaValPtr)0x0) {
    return (xmlSchemaValPtr)0x0;
  }
  pxVar11 = (xmlSchemaValPtr)0x0;
  value = (xmlSchemaValPtr)0x0;
  do {
    xVar1 = val->type;
    switch(xVar1) {
    case XML_SCHEMAS_STRING:
    case XML_SCHEMAS_NORMSTRING:
    case XML_SCHEMAS_TOKEN:
    case XML_SCHEMAS_LANGUAGE:
    case XML_SCHEMAS_NMTOKEN:
    case XML_SCHEMAS_NAME:
    case XML_SCHEMAS_NCNAME:
    case XML_SCHEMAS_ID:
    case XML_SCHEMAS_IDREF:
    case XML_SCHEMAS_ENTITY:
    case XML_SCHEMAS_ANYURI:
    case XML_SCHEMAS_ANYSIMPLETYPE:
      pxVar10 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
      if (pxVar10 != (xmlSchemaValPtr)0x0) {
        *(undefined8 *)pxVar10 = 0;
        pxVar10->next = (_xmlSchemaVal *)0x0;
        (pxVar10->value).decimal.hi = 0;
        *(undefined8 *)((long)&pxVar10->value + 0x18) = 0;
        (pxVar10->value).decimal.lo = 0;
        (pxVar10->value).decimal.mi = 0;
        pxVar10->type = xVar1;
LAB_001d0f49:
        uVar7 = *(undefined4 *)&val->field_0x4;
        p_Var2 = val->next;
        uVar3 = (val->value).decimal.lo;
        uVar4 = (val->value).decimal.mi;
        uVar5 = (val->value).decimal.hi;
        uVar6 = *(undefined8 *)((long)&val->value + 0x18);
        pxVar10->type = val->type;
        *(undefined4 *)&pxVar10->field_0x4 = uVar7;
        pxVar10->next = p_Var2;
        (pxVar10->value).decimal.lo = uVar3;
        (pxVar10->value).decimal.mi = uVar4;
        (pxVar10->value).decimal.hi = uVar5;
        *(undefined8 *)((long)&pxVar10->value + 0x18) = uVar6;
        pxVar10->next = (_xmlSchemaVal *)0x0;
      }
      break;
    default:
      pxVar10 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
      if (pxVar10 == (xmlSchemaValPtr)0x0) {
        pxVar10 = (xmlSchemaValPtr)0x0;
      }
      else {
        *(undefined8 *)pxVar10 = 0;
        pxVar10->next = (_xmlSchemaVal *)0x0;
        (pxVar10->value).decimal.hi = 0;
        *(undefined8 *)((long)&pxVar10->value + 0x18) = 0;
        (pxVar10->value).decimal.lo = 0;
        (pxVar10->value).decimal.mi = 0;
        pxVar10->type = xVar1;
        uVar7 = *(undefined4 *)&val->field_0x4;
        p_Var2 = val->next;
        uVar3 = (val->value).decimal.lo;
        uVar4 = (val->value).decimal.mi;
        uVar5 = (val->value).decimal.hi;
        uVar6 = *(undefined8 *)((long)&val->value + 0x18);
        pxVar10->type = val->type;
        *(undefined4 *)&pxVar10->field_0x4 = uVar7;
        pxVar10->next = p_Var2;
        (pxVar10->value).decimal.lo = uVar3;
        (pxVar10->value).decimal.mi = uVar4;
        (pxVar10->value).decimal.hi = uVar5;
        *(undefined8 *)((long)&pxVar10->value + 0x18) = uVar6;
        pxVar10->next = (_xmlSchemaVal *)0x0;
      }
      goto LAB_001d0f7c;
    case XML_SCHEMAS_NMTOKENS:
    case XML_SCHEMAS_IDREFS:
    case XML_SCHEMAS_ENTITIES:
    case XML_SCHEMAS_ANYTYPE:
      xmlSchemaFreeValue(value);
      return (xmlSchemaValPtr)0x0;
    case XML_SCHEMAS_QNAME:
    case XML_SCHEMAS_NOTATION:
      pxVar10 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
      if (pxVar10 != (xmlSchemaValPtr)0x0) {
        *(undefined8 *)pxVar10 = 0;
        pxVar10->next = (_xmlSchemaVal *)0x0;
        (pxVar10->value).decimal.hi = 0;
        *(undefined8 *)((long)&pxVar10->value + 0x18) = 0;
        (pxVar10->value).decimal.lo = 0;
        (pxVar10->value).decimal.mi = 0;
        pxVar10->type = xVar1;
        uVar7 = *(undefined4 *)&val->field_0x4;
        p_Var2 = val->next;
        uVar3 = (val->value).decimal.lo;
        uVar4 = (val->value).decimal.mi;
        uVar5 = (val->value).decimal.hi;
        uVar6 = *(undefined8 *)((long)&val->value + 0x18);
        pxVar10->type = val->type;
        *(undefined4 *)&pxVar10->field_0x4 = uVar7;
        pxVar10->next = p_Var2;
        (pxVar10->value).decimal.lo = uVar3;
        (pxVar10->value).decimal.mi = uVar4;
        (pxVar10->value).decimal.hi = uVar5;
        *(undefined8 *)((long)&pxVar10->value + 0x18) = uVar6;
        pxVar10->next = (_xmlSchemaVal *)0x0;
      }
      pxVar8 = (val->value).qname.name;
      if (pxVar8 != (xmlChar *)0x0) {
        pxVar8 = xmlStrdup(pxVar8);
        (pxVar10->value).qname.name = pxVar8;
      }
      pxVar8 = (val->value).qname.uri;
      if (pxVar8 != (xmlChar *)0x0) {
        pxVar8 = xmlStrdup(pxVar8);
        (pxVar10->value).qname.uri = pxVar8;
      }
      goto LAB_001d0f7c;
    case XML_SCHEMAS_HEXBINARY:
      pxVar10 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
      if (pxVar10 != (xmlSchemaValPtr)0x0) {
        *(undefined8 *)pxVar10 = 0;
        pxVar10->next = (_xmlSchemaVal *)0x0;
        (pxVar10->value).decimal.hi = 0;
        *(undefined8 *)((long)&pxVar10->value + 0x18) = 0;
        (pxVar10->value).decimal.lo = 0;
        (pxVar10->value).decimal.mi = 0;
        pxVar10->type = XML_SCHEMAS_HEXBINARY;
        goto LAB_001d0f49;
      }
      break;
    case XML_SCHEMAS_BASE64BINARY:
      pxVar10 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
      if (pxVar10 != (xmlSchemaValPtr)0x0) {
        *(undefined8 *)pxVar10 = 0;
        pxVar10->next = (_xmlSchemaVal *)0x0;
        (pxVar10->value).decimal.hi = 0;
        *(undefined8 *)((long)&pxVar10->value + 0x18) = 0;
        (pxVar10->value).decimal.lo = 0;
        (pxVar10->value).decimal.mi = 0;
        pxVar10->type = XML_SCHEMAS_BASE64BINARY;
        goto LAB_001d0f49;
      }
    }
    pxVar8 = (val->value).qname.name;
    if (pxVar8 != (xmlChar *)0x0) {
      pxVar8 = xmlStrdup(pxVar8);
      (pxVar10->value).qname.name = pxVar8;
    }
LAB_001d0f7c:
    pxVar9 = pxVar10;
    if (value != (xmlSchemaValPtr)0x0) {
      pxVar11->next = pxVar10;
      pxVar9 = value;
    }
    val = val->next;
    pxVar11 = pxVar10;
    value = pxVar9;
    if (val == (_xmlSchemaVal *)0x0) {
      return pxVar9;
    }
  } while( true );
}

Assistant:

xmlSchemaValPtr
xmlSchemaCopyValue(xmlSchemaValPtr val)
{
    xmlSchemaValPtr ret = NULL, prev = NULL, cur;

    /*
    * Copy the string values.
    */
    while (val != NULL) {
	switch (val->type) {
	    case XML_SCHEMAS_ANYTYPE:
	    case XML_SCHEMAS_IDREFS:
	    case XML_SCHEMAS_ENTITIES:
	    case XML_SCHEMAS_NMTOKENS:
		xmlSchemaFreeValue(ret);
		return (NULL);
	    case XML_SCHEMAS_ANYSIMPLETYPE:
	    case XML_SCHEMAS_STRING:
	    case XML_SCHEMAS_NORMSTRING:
	    case XML_SCHEMAS_TOKEN:
	    case XML_SCHEMAS_LANGUAGE:
	    case XML_SCHEMAS_NAME:
	    case XML_SCHEMAS_NCNAME:
	    case XML_SCHEMAS_ID:
	    case XML_SCHEMAS_IDREF:
	    case XML_SCHEMAS_ENTITY:
	    case XML_SCHEMAS_NMTOKEN:
	    case XML_SCHEMAS_ANYURI:
		cur = xmlSchemaDupVal(val);
		if (val->value.str != NULL)
		    cur->value.str = xmlStrdup(BAD_CAST val->value.str);
		break;
	    case XML_SCHEMAS_QNAME:
	    case XML_SCHEMAS_NOTATION:
		cur = xmlSchemaDupVal(val);
		if (val->value.qname.name != NULL)
		    cur->value.qname.name =
                    xmlStrdup(BAD_CAST val->value.qname.name);
		if (val->value.qname.uri != NULL)
		    cur->value.qname.uri =
                    xmlStrdup(BAD_CAST val->value.qname.uri);
		break;
	    case XML_SCHEMAS_HEXBINARY:
		cur = xmlSchemaDupVal(val);
		if (val->value.hex.str != NULL)
		    cur->value.hex.str = xmlStrdup(BAD_CAST val->value.hex.str);
		break;
	    case XML_SCHEMAS_BASE64BINARY:
		cur = xmlSchemaDupVal(val);
		if (val->value.base64.str != NULL)
		    cur->value.base64.str =
                    xmlStrdup(BAD_CAST val->value.base64.str);
		break;
	    default:
		cur = xmlSchemaDupVal(val);
		break;
	}
	if (ret == NULL)
	    ret = cur;
	else
	    prev->next = cur;
	prev = cur;
	val = val->next;
    }
    return (ret);
}